

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_common.c
# Opt level: O0

void * CP_distributeDataFromRankZero
                 (SstStream Stream,void *root_info,FFSTypeHandle Type,void **RetDataBlock)

{
  undefined8 uVar1;
  undefined8 uVar2;
  void *__src;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  FFSContext context;
  char *tmp;
  size_t encodeSize;
  FFSBuffer Buf;
  void *RetVal;
  char *Buffer;
  int DataSize;
  SMPI_Comm in_stack_00000118;
  int in_stack_00000124;
  SMPI_Datatype in_stack_00000128;
  int in_stack_0000012c;
  void *in_stack_00000130;
  int local_48 [2];
  undefined8 local_40;
  void *local_38;
  void *local_30;
  int local_24;
  undefined8 *local_20;
  undefined8 local_18;
  undefined8 local_10;
  long *local_8;
  
  local_20 = in_RCX;
  local_8 = in_RDI;
  if ((int)in_RDI[0x15] == 0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    uVar1 = create_FFSBuffer();
    local_40 = uVar1;
    uVar2 = FMFormat_of_original(local_18);
    __src = (void *)FFSencode(uVar1,uVar2,local_10,local_48);
    local_24 = local_48[0];
    SMPI_Bcast(in_stack_00000130,in_stack_0000012c,in_stack_00000128,in_stack_00000124,
               in_stack_00000118);
    SMPI_Bcast(in_stack_00000130,in_stack_0000012c,in_stack_00000128,in_stack_00000124,
               in_stack_00000118);
    local_30 = malloc((long)local_24);
    memcpy(local_30,__src,(long)local_24);
    free_FFSBuffer(local_40);
  }
  else {
    SMPI_Bcast(in_stack_00000130,in_stack_0000012c,in_stack_00000128,in_stack_00000124,
               in_stack_00000118);
    local_30 = malloc((long)local_24);
    SMPI_Bcast(in_stack_00000130,in_stack_0000012c,in_stack_00000128,in_stack_00000124,
               in_stack_00000118);
  }
  FFSdecode_in_place(*(undefined8 *)(*local_8 + 8),local_30,&local_38);
  *local_20 = local_30;
  return local_38;
}

Assistant:

void *CP_distributeDataFromRankZero(SstStream Stream, void *root_info, FFSTypeHandle Type,
                                    void **RetDataBlock)
{
    int DataSize;
    char *Buffer;
    void *RetVal;

    if (Stream->Rank == 0)
    {
        FFSBuffer Buf = create_FFSBuffer();
        size_t encodeSize;
        char *tmp = FFSencode(Buf, FMFormat_of_original(Type), root_info, &encodeSize);
        DataSize = (int)encodeSize;
        SMPI_Bcast(&DataSize, 1, SMPI_INT, 0, Stream->mpiComm);
        SMPI_Bcast(tmp, DataSize, SMPI_CHAR, 0, Stream->mpiComm);
        Buffer = malloc(DataSize);
        memcpy(Buffer, tmp, DataSize);
        free_FFSBuffer(Buf);
    }
    else
    {
        SMPI_Bcast(&DataSize, 1, SMPI_INT, 0, Stream->mpiComm);
        Buffer = malloc(DataSize);
        SMPI_Bcast(Buffer, DataSize, SMPI_CHAR, 0, Stream->mpiComm);
    }

    FFSContext context = Stream->CPInfo->ffs_c;
    // FFSTypeHandle ffs_type = FFSTypeHandle_from_encode(context, Buffer);

    FFSdecode_in_place(context, Buffer, &RetVal);
    //    printf("Decode for rank %d is : \n", Stream->Rank);
    //    FMdump_data(FMFormat_of_original(Type), RetVal, 1024000);
    *RetDataBlock = Buffer;
    return RetVal;
}